

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::bt_peer_connection::write_hash_request(bt_peer_connection *this,hash_request *req)

{
  _Atomic_word *p_Var1;
  pointer *pphVar2;
  int iVar3;
  uint uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  iterator __position;
  byte bVar6;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  int iVar14;
  int iVar15;
  element_type *peVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar17;
  span<const_char> buf_00;
  char buf [53];
  sha256_hash root;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '1';
  buf[4] = '\x15';
  p_Var5 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    peVar16 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
              super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_weak_count = p_Var5->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_weak_count = p_Var5->_M_weak_count + 1;
    }
    iVar15 = p_Var5->_M_use_count;
    do {
      if (iVar15 == 0) {
        peVar16 = (element_type *)0x0;
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        goto LAB_0018c942;
      }
      LOCK();
      iVar3 = p_Var5->_M_use_count;
      bVar17 = iVar15 == iVar3;
      if (bVar17) {
        p_Var5->_M_use_count = iVar15 + 1;
        iVar3 = iVar15;
      }
      iVar15 = iVar3;
      UNLOCK();
    } while (!bVar17);
    this_00 = p_Var5;
    if (p_Var5->_M_use_count == 0) {
      peVar16 = (element_type *)0x0;
    }
LAB_0018c942:
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var5->_M_weak_count;
      iVar15 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar15 = p_Var5->_M_weak_count;
      p_Var5->_M_weak_count = iVar15 + -1;
    }
    if (iVar15 == 1) {
      (*p_Var5->_vptr__Sp_counted_base[3])();
    }
    if (peVar16 != (element_type *)0x0) {
      file_storage::root(&root,&((peVar16->super_torrent_hot_members).m_torrent_file.
                                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->m_files,(file_index_t)(req->file).m_val);
      buf._21_8_ = root.m_number._M_elems._16_8_;
      buf._29_8_ = root.m_number._M_elems._24_8_;
      buf._5_8_ = root.m_number._M_elems._0_8_;
      buf._13_8_ = root.m_number._M_elems._8_8_;
      uVar4 = req->base;
      uVar11 = (ushort)(uVar4 >> 0x10) & 0xff;
      uVar12 = (ushort)(uVar4 >> 8) & 0xff;
      uVar13 = (ushort)uVar4 & 0xff;
      bVar7 = (byte)(uVar4 >> 0x18);
      uVar10 = (ushort)bVar7;
      bVar6 = (uVar10 != 0) * (uVar10 < 0x100) * bVar7 - (0xff < uVar10);
      bVar7 = ((uVar4 & 0xff0000) != 0) * (uVar11 < 0x100) * (char)(uVar4 >> 0x10) - (0xff < uVar11)
      ;
      bVar8 = ((uVar4 & 0xff00) != 0) * (uVar12 < 0x100) * (char)(uVar4 >> 8) - (0xff < uVar12);
      bVar9 = ((uVar4 & 0xff) != 0) * (uVar13 < 0x100) * (char)uVar4 - (0xff < uVar13);
      buf[0x26] = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
      buf[0x25] = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
      buf[0x27] = (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8);
      buf[0x28] = (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9);
      uVar4 = req->index;
      uVar11 = (ushort)(uVar4 >> 0x10) & 0xff;
      uVar12 = (ushort)(uVar4 >> 8) & 0xff;
      uVar13 = (ushort)uVar4 & 0xff;
      bVar7 = (byte)(uVar4 >> 0x18);
      uVar10 = (ushort)bVar7;
      bVar7 = (uVar10 != 0) * (uVar10 < 0x100) * bVar7 - (0xff < uVar10);
      bVar8 = ((uVar4 & 0xff0000) != 0) * (uVar11 < 0x100) * (char)(uVar4 >> 0x10) - (0xff < uVar11)
      ;
      bVar9 = ((uVar4 & 0xff00) != 0) * (uVar12 < 0x100) * (char)(uVar4 >> 8) - (0xff < uVar12);
      bVar6 = ((uVar4 & 0xff) != 0) * (uVar13 < 0x100) * (char)uVar4 - (0xff < uVar13);
      buf[0x2a] = (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8);
      buf[0x29] = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
      buf[0x2b] = (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9);
      buf[0x2c] = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
      uVar4 = req->count;
      uVar11 = (ushort)(uVar4 >> 0x10) & 0xff;
      uVar12 = (ushort)(uVar4 >> 8) & 0xff;
      uVar13 = (ushort)uVar4 & 0xff;
      bVar7 = (byte)(uVar4 >> 0x18);
      uVar10 = (ushort)bVar7;
      bVar6 = (uVar10 != 0) * (uVar10 < 0x100) * bVar7 - (0xff < uVar10);
      bVar9 = ((uVar4 & 0xff0000) != 0) * (uVar11 < 0x100) * (char)(uVar4 >> 0x10) - (0xff < uVar11)
      ;
      bVar7 = ((uVar4 & 0xff00) != 0) * (uVar12 < 0x100) * (char)(uVar4 >> 8) - (0xff < uVar12);
      bVar8 = ((uVar4 & 0xff) != 0) * (uVar13 < 0x100) * (char)uVar4 - (0xff < uVar13);
      buf[0x2e] = (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9);
      buf[0x2d] = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
      buf[0x2f] = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
      buf[0x30] = (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8);
      uVar4 = req->proof_layers;
      uVar11 = (ushort)(uVar4 >> 0x10) & 0xff;
      uVar12 = (ushort)(uVar4 >> 8) & 0xff;
      uVar13 = (ushort)uVar4 & 0xff;
      bVar7 = (byte)(uVar4 >> 0x18);
      uVar10 = (ushort)bVar7;
      bVar7 = (uVar10 != 0) * (uVar10 < 0x100) * bVar7 - (0xff < uVar10);
      bVar8 = ((uVar4 & 0xff0000) != 0) * (uVar11 < 0x100) * (char)(uVar4 >> 0x10) - (0xff < uVar11)
      ;
      bVar9 = ((uVar4 & 0xff00) != 0) * (uVar12 < 0x100) * (char)(uVar4 >> 8) - (0xff < uVar12);
      bVar6 = ((uVar4 & 0xff) != 0) * (uVar13 < 0x100) * (char)uVar4 - (0xff < uVar13);
      buf[0x32] = (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8);
      buf[0x31] = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
      buf[0x33] = (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9);
      buf[0x34] = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
      counters::inc_stats_counter((this->super_peer_connection).m_counters,0x68,1);
      __position._M_current =
           (this->m_hash_requests).
           super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_hash_requests).
          super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<libtorrent::aux::hash_request,std::allocator<libtorrent::aux::hash_request>>::
        _M_realloc_insert<libtorrent::aux::hash_request_const&>
                  ((vector<libtorrent::aux::hash_request,std::allocator<libtorrent::aux::hash_request>>
                    *)&this->m_hash_requests,__position,req);
      }
      else {
        (__position._M_current)->proof_layers = req->proof_layers;
        iVar15 = req->base;
        iVar3 = req->index;
        iVar14 = req->count;
        (__position._M_current)->file = (file_index_t)(req->file).m_val;
        (__position._M_current)->base = iVar15;
        (__position._M_current)->index = iVar3;
        (__position._M_current)->count = iVar14;
        pphVar2 = &(this->m_hash_requests).
                   super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pphVar2 = *pphVar2 + 1;
      }
      bVar17 = peer_connection::should_log(&this->super_peer_connection,outgoing_message);
      if (bVar17) {
        peer_connection::peer_log
                  (&this->super_peer_connection,outgoing_message,"HASH_REQUEST",
                   "file: %d base: %d idx: %d cnt: %d proofs: %d",(ulong)(uint)(req->file).m_val,
                   (ulong)(uint)req->base,(ulong)(uint)req->index,(ulong)(uint)req->count,
                   (ulong)(uint)req->proof_layers);
      }
      buf_00.m_len = 0x35;
      buf_00.m_ptr = buf;
      peer_connection::send_buffer(&this->super_peer_connection,buf_00);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  return;
}

Assistant:

void bt_peer_connection::write_hash_request(hash_request const& req)
	{
		INVARIANT_CHECK;

		char buf[5 + sha256_hash::size() + 4 * 4];
		char* ptr = buf;
		aux::write_uint32(int(sizeof(buf) - 4), ptr);
		aux::write_uint8(msg_hash_request, ptr);

		auto t = associated_torrent().lock();
		if (!t) return;
		auto const& ti = t->torrent_file();
		auto const& fs = ti.files();
		auto const root = fs.root(req.file);

		ptr = std::copy(root.begin(), root.end(), ptr);

		TORRENT_ASSERT(validate_hash_request(req, t->torrent_file().files()));

		aux::write_uint32(req.base, ptr);
		aux::write_uint32(req.index, ptr);
		aux::write_uint32(req.count, ptr);
		aux::write_uint32(req.proof_layers, ptr);

		stats_counters().inc_stats_counter(counters::num_outgoing_hash_request);

		m_hash_requests.push_back(req);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::outgoing_message))
		{
			peer_log(peer_log_alert::outgoing_message, "HASH_REQUEST"
				, "file: %d base: %d idx: %d cnt: %d proofs: %d"
				, int(req.file), req.base, req.index, req.count, req.proof_layers);
		}
#endif

		send_buffer(buf);
	}